

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

print * __thiscall
lest::for_test<lest::print>(lest *this,tests *specification,texts *in,print *perform,int n)

{
  int iVar1;
  int iVar2;
  fd_set *__exceptfds;
  int iVar3;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  test *__str;
  string local_78 [32];
  test local_58;
  
  iVar2 = (int)perform;
  iVar3 = 0;
  while( true ) {
    __exceptfds = (fd_set *)
                  (ulong)CONCAT31((int3)((ulong)perform >> 8),iVar3 < iVar2 || iVar2 == -1);
    if (iVar3 >= iVar2 && iVar2 != -1) break;
    for (__str = *(test **)this; __str != *(test **)(this + 8); __str = __str + 1) {
      std::__cxx11::string::string(local_78,&__str->name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      iVar1 = select((int)local_78,(fd_set *)&stack0xffffffffffffff70,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff70);
      std::__cxx11::string::~string(local_78);
      if ((char)iVar1 != '\0') {
        test::test(&local_58,__str);
        print::operator()((print *)in,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
    iVar3 = iVar3 + 1;
  }
  return (print *)in;
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}